

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Value * __thiscall
soul::heart::BinaryOperator::getAsConstant(Value *__return_storage_ptr__,BinaryOperator *this)

{
  bool bVar1;
  Value b;
  Value a;
  anon_class_8_1_8991fb9c local_e8;
  Value local_e0;
  Value local_a0;
  Value local_60;
  
  (*(((this->lhs).object)->super_Object)._vptr_Object[7])(&local_a0);
  if (local_a0.type.category != invalid) {
    (*(((this->rhs).object)->super_Object)._vptr_Object[7])(&local_e0);
    if (local_e0.type.category != invalid) {
      soul::Value::Value(&local_60,&local_e0);
      local_e8.this = this;
      bVar1 = BinaryOp::
              apply<soul::heart::BinaryOperator::getAsConstant()const::_lambda(soul::CompileMessage)_1_>
                        (&local_a0,&local_60,this->operation,&local_e8);
      soul::Value::~Value(&local_60);
      if (bVar1) {
        soul::Value::Value(__return_storage_ptr__,&local_a0);
        soul::Value::~Value(&local_e0);
        goto LAB_00242421;
      }
    }
    soul::Value::~Value(&local_e0);
  }
  (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->allocatedData).allocatedSize = 0;
  (__return_storage_ptr__->type).category = invalid;
  (__return_storage_ptr__->type).arrayElementCategory = invalid;
  (__return_storage_ptr__->type).isRef = false;
  (__return_storage_ptr__->type).isConstant = false;
  (__return_storage_ptr__->type).primitiveType = invalid;
  (__return_storage_ptr__->type).boundingSize = 0;
  (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.items =
       (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
  (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_00242421:
  soul::Value::~Value(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto a = lhs->getAsConstant();

            if (a.isValid())
            {
                auto b = rhs->getAsConstant();

                if (b.isValid())
                    if (BinaryOp::apply (a, b, operation,
                                         [this] (CompileMessage message) { location.throwError (message); }))
                        return a;
            }

            return {};
        }